

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cpp
# Opt level: O3

void __thiscall File_ReadWriteFile_Test::~File_ReadWriteFile_Test(File_ReadWriteFile_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(File, ReadWriteFile) {
    std::string fn = inTestDir("readwrite.txt");
    std::string str = "this is a test.";
    EXPECT_TRUE(WriteFile(fn, str));
    std::string contents = ReadFileContents(fn);
    EXPECT_FALSE(contents.empty());
    EXPECT_EQ(str, contents);
    EXPECT_EQ(0, remove(fn.c_str()));
}